

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTestContiguous.cpp
# Opt level: O0

int __thiscall
Hpipe::InstructionTestContiguous::clone
          (InstructionTestContiguous *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,
          ...)

{
  Context *pCVar1;
  size_type sVar2;
  uint *puVar3;
  InstructionNone *this_00;
  InstructionTestContiguous *this_01;
  Context local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_30;
  Vec<unsigned_int> *keep_ind_local;
  Context *ncx_local;
  PtrPool<Hpipe::Instruction,_32> *inst_pool_local;
  InstructionTestContiguous *this_local;
  
  local_30 = ___flags;
  keep_ind_local = (Vec<unsigned_int> *)__child_stack;
  ncx_local = (Context *)__fn;
  inst_pool_local = (PtrPool<Hpipe::Instruction,_32> *)this;
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(___flags);
  if (sVar2 == 1) {
    puVar3 = Vec<unsigned_int>::operator[]((Vec<unsigned_int> *)local_30,0);
    pCVar1 = ncx_local;
    if (*puVar3 == 1) {
      this_00 = (InstructionNone *)operator_new(0x178);
      Context::Context(&local_a0,(Context *)keep_ind_local);
      InstructionNone::Instruction(this_00,&local_a0);
      this_local = (InstructionTestContiguous *)
                   PtrPool<Hpipe::Instruction,32>::operator<<
                             ((PtrPool<Hpipe::Instruction,32> *)pCVar1,this_00);
      Context::~Context(&local_a0);
      goto LAB_0023e9fb;
    }
  }
  pCVar1 = ncx_local;
  this_01 = (InstructionTestContiguous *)operator_new(0x180);
  InstructionTestContiguous
            (this_01,(Context *)keep_ind_local,(bool)((this->super_Instruction).field_0x174 & 1),
             this->nb_chars);
  this_local = PtrPool<Hpipe::Instruction,32>::operator<<
                         ((PtrPool<Hpipe::Instruction,32> *)pCVar1,this_01);
LAB_0023e9fb:
  return (int)this_local;
}

Assistant:

Instruction *InstructionTestContiguous::clone( PtrPool<Instruction> &inst_pool, const Context &ncx, const Vec<unsigned> &keep_ind ) {
    if ( keep_ind.size() == 1 and keep_ind[ 0 ] == 1 )
        return inst_pool << new InstructionNone( ncx );
    return inst_pool << new InstructionTestContiguous( ncx, beg, nb_chars );
}